

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  bool bVar1;
  CodedOutputStream *output_00;
  CodedOutputStream *output_01;
  void *in_RCX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  uint8 *ptr;
  FieldMetadata *field_metadata;
  int i;
  SpecialSerializer func;
  undefined4 in_stack_00000030;
  FieldMetadata *md;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  FieldMetadata *md_00;
  
  md_00 = (FieldMetadata *)0x0;
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    md = (FieldMetadata *)(in_RSI + (long)iVar2 * 0x18);
    output_00 = (CodedOutputStream *)((long)in_RDI + (ulong)md->offset);
    output_01 = (CodedOutputStream *)(ulong)md->type;
    switch(output_01) {
    case (CodedOutputStream *)0x0:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40cefa);
      }
      break;
    case (CodedOutputStream *)0x1:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40cfca);
      }
      break;
    case (CodedOutputStream *)0x2:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d09a);
      }
      break;
    case (CodedOutputStream *)0x3:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d16a);
      }
      break;
    case (CodedOutputStream *)0x4:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d23a);
      }
      break;
    case (CodedOutputStream *)0x5:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d30a);
      }
      break;
    case (CodedOutputStream *)0x6:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d3da);
      }
      break;
    case (CodedOutputStream *)0x7:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d4aa);
      }
      break;
    case (CodedOutputStream *)0x8:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (md,(FieldMetadata *)output_00,output_01);
      }
      break;
    case (CodedOutputStream *)0x9:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d64a);
      }
      break;
    case (CodedOutputStream *)0xa:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d71a);
      }
      break;
    case (CodedOutputStream *)0xb:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (md,(FieldMetadata *)output_00,output_01);
      }
      break;
    case (CodedOutputStream *)0xc:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d8ba);
      }
      break;
    case (CodedOutputStream *)0xd:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d98a);
      }
      break;
    case (CodedOutputStream *)0xe:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40da5a);
      }
      break;
    case (CodedOutputStream *)0xf:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40db2a);
      }
      break;
    case (CodedOutputStream *)0x10:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40dbfa);
      }
      break;
    case (CodedOutputStream *)0x11:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40dcca);
      }
      break;
    default:
      SerializeNotImplemented(field_metadata._4_4_);
      break;
    case (CodedOutputStream *)0x14:
      bVar1 = IsNull<1>(output_00);
      if (!bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40cf28);
      }
      break;
    case (CodedOutputStream *)0x15:
      bVar1 = IsNull<2>(output_00);
      if (!bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40cff8);
      }
      break;
    case (CodedOutputStream *)0x16:
      bVar1 = IsNull<3>(output_00);
      if (!bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d0c8);
      }
      break;
    case (CodedOutputStream *)0x17:
      bVar1 = IsNull<4>(output_00);
      if (!bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d198);
      }
      break;
    case (CodedOutputStream *)0x18:
      bVar1 = IsNull<5>(output_00);
      if (!bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d268);
      }
      break;
    case (CodedOutputStream *)0x19:
      bVar1 = IsNull<6>(output_00);
      if (!bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d338);
      }
      break;
    case (CodedOutputStream *)0x1a:
      bVar1 = IsNull<7>(output_00);
      if (!bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d408);
      }
      break;
    case (CodedOutputStream *)0x1b:
      bVar1 = IsNull<8>(output_00);
      if (!bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d4d8);
      }
      break;
    case (CodedOutputStream *)0x1c:
      bVar1 = IsNull<9>(output_01);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (md,(FieldMetadata *)output_00,output_01);
      }
      break;
    case (CodedOutputStream *)0x1d:
      bVar1 = IsNull<10>((void *)0x40d659);
      if (!bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d678);
      }
      break;
    case (CodedOutputStream *)0x1e:
      bVar1 = IsNull<11>((void *)0x40d729);
      if (!bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d748);
      }
      break;
    case (CodedOutputStream *)0x1f:
      bVar1 = IsNull<12>(output_01);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (md,(FieldMetadata *)output_00,output_01);
      }
      break;
    case (CodedOutputStream *)0x20:
      bVar1 = IsNull<13>(output_00);
      if (!bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d8e8);
      }
      break;
    case (CodedOutputStream *)0x21:
      bVar1 = IsNull<14>(output_00);
      if (!bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d9b8);
      }
      break;
    case (CodedOutputStream *)0x22:
      bVar1 = IsNull<15>(output_00);
      if (!bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40da88);
      }
      break;
    case (CodedOutputStream *)0x23:
      bVar1 = IsNull<16>(output_00);
      if (!bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40db58);
      }
      break;
    case (CodedOutputStream *)0x24:
      bVar1 = IsNull<17>(output_00);
      if (!bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40dc28);
      }
      break;
    case (CodedOutputStream *)0x25:
      bVar1 = IsNull<18>(output_00);
      if (!bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40dcf8);
      }
      break;
    case (CodedOutputStream *)0x28:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x29:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x2a:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x2b:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x2c:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x2d:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x2e:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x2f:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x30:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x31:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x32:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x33:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x34:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x35:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x36:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x37:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x38:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x39:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (CodedOutputStream *)0x3c:
      PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x3d:
      PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x3e:
      PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x3f:
      PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x40:
      PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x41:
      PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x42:
      PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x43:
      PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x44:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (CodedOutputStream *)0x45:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (CodedOutputStream *)0x46:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (CodedOutputStream *)0x47:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (CodedOutputStream *)0x48:
      PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x49:
      PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x4a:
      PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x4b:
      PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x4c:
      PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x4d:
      PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_00,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (CodedOutputStream *)0x50:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40cf96);
      }
      break;
    case (CodedOutputStream *)0x51:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d066);
      }
      break;
    case (CodedOutputStream *)0x52:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d136);
      }
      break;
    case (CodedOutputStream *)0x53:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d206);
      }
      break;
    case (CodedOutputStream *)0x54:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d2d6);
      }
      break;
    case (CodedOutputStream *)0x55:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d3a6);
      }
      break;
    case (CodedOutputStream *)0x56:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d476);
      }
      break;
    case (CodedOutputStream *)0x57:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d546);
      }
      break;
    case (CodedOutputStream *)0x58:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d616);
      }
      break;
    case (CodedOutputStream *)0x59:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d6e6);
      }
      break;
    case (CodedOutputStream *)0x5a:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d7b6);
      }
      break;
    case (CodedOutputStream *)0x5b:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<12>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d886);
      }
      break;
    case (CodedOutputStream *)0x5c:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40d956);
      }
      break;
    case (CodedOutputStream *)0x5d:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40da26);
      }
      break;
    case (CodedOutputStream *)0x5e:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40daf6);
      }
      break;
    case (CodedOutputStream *)0x5f:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40dbc6);
      }
      break;
    case (CodedOutputStream *)0x60:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40dc96);
      }
      break;
    case (CodedOutputStream *)0x61:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,(FieldMetadata *)output_01,(CodedOutputStream *)0x40dd60);
      }
      break;
    case (CodedOutputStream *)0x64:
      md_00 = (FieldMetadata *)md->ptr;
      (*(code *)md_00)(in_RDI,md->offset,md->tag,md->has_offset,in_RCX);
    }
  }
  return;
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}